

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

int GetMacroArgumentValue(char **src,char **dst)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char cVar9;
  char *badValueMessage;
  ulong uVar10;
  uint local_40 [4];
  
  badValueMessage = *src;
  cVar9 = *badValueMessage;
  while ((byte)(cVar9 - 1U) < 0x20) {
    badValueMessage = badValueMessage + 1;
    *src = badValueMessage;
    cVar9 = *badValueMessage;
  }
  pcVar3 = *dst;
  pcVar5 = pcVar3;
  pcVar7 = badValueMessage;
LAB_001255f3:
  if ((cVar9 == '\0') || (cVar9 == ',')) {
    pcVar7 = *dst;
    while ((pcVar5 < pcVar7 && (pcVar8 = pcVar7 + -1, (byte)(*pcVar8 - 1U) < 0x20))) {
      *dst = pcVar8;
      pcVar7 = pcVar8;
    }
    *pcVar7 = '\0';
    if (*pcVar3 == '\0') {
      Warning("[Macro argument parser] empty value",badValueMessage,W_PASS3);
    }
    return 1;
  }
  local_40[0] = 1;
  local_40[1] = 2;
  local_40[2] = (badValueMessage != pcVar7) + 3;
  lVar6 = 0;
  do {
    uVar2 = *(uint *)((long)local_40 + lVar6);
    uVar10 = (ulong)uVar2;
    if (" \"\'<"[uVar10] == cVar9) {
      if (uVar10 == 0) break;
      if (uVar2 != 3) {
        if ((((uVar2 == 2) && (badValueMessage < pcVar7)) &&
            ((byte)((pcVar7[-1] | 0x20U) - 0x30) < 10 || (byte)((pcVar7[-1] | 0x20U) + 0x9f) < 6))
           && ((byte)((pcVar7[1] | 0x20U) - 0x30) < 10 || (byte)((pcVar7[1] | 0x20U) + 0x9f) < 6))
        break;
        pcVar7 = *dst;
        *dst = pcVar7 + 1;
        *pcVar7 = cVar9;
        pcVar7 = *src;
      }
      pcVar8 = pcVar7 + 1;
      *src = pcVar8;
      cVar9 = " \"\'>"[uVar10];
      cVar4 = pcVar7[1];
      goto LAB_001256c8;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  *src = pcVar7 + 1;
  cVar9 = *pcVar7;
  pcVar7 = *dst;
  *dst = pcVar7 + 1;
  *pcVar7 = cVar9;
  pcVar7 = *src;
  goto LAB_001257b2;
LAB_001256c8:
  if (cVar4 == '\0') goto LAB_00125781;
  if (uVar10 == 1) {
    if (cVar4 == '\\') {
      if (pcVar8[1] != '\0') goto LAB_0012571e;
      cVar4 = '\\';
    }
    goto LAB_00125759;
  }
  if (uVar2 == 2) {
    if ((cVar4 != '\'') || (cVar4 = '\'', pcVar8[1] != '\'')) goto LAB_00125759;
LAB_0012571e:
    *src = pcVar8 + 1;
    cVar4 = *pcVar8;
    pcVar7 = *dst;
    *dst = pcVar7 + 1;
    *pcVar7 = cVar4;
    pcVar7 = *src;
    *src = pcVar7 + 1;
    cVar4 = *pcVar7;
LAB_00125767:
    pcVar7 = *dst;
    *dst = pcVar7 + 1;
    *pcVar7 = cVar4;
  }
  else {
    if (uVar2 != 3) {
      Error("Internal error. GetMacroArgumentValue()",(char *)0x0,FATAL);
      pcVar8 = *src;
      cVar4 = *pcVar8;
LAB_00125759:
      if (cVar9 != cVar4) {
        *src = pcVar8 + 1;
        cVar4 = *pcVar8;
        goto LAB_00125767;
      }
      goto LAB_0012578a;
    }
    if ((cVar4 != '!') || ((cVar1 = pcVar8[1], cVar1 != '>' && (cVar4 = '!', cVar1 != '!'))))
    goto LAB_00125759;
    pcVar7 = *dst;
    *dst = pcVar7 + 1;
    *pcVar7 = cVar1;
    *src = *src + 2;
  }
  pcVar8 = *src;
  cVar4 = *pcVar8;
  goto LAB_001256c8;
LAB_00125781:
  if (uVar2 != 4) {
    **dst = '\0';
    return 0;
  }
LAB_0012578a:
  if (uVar2 < 3) {
    pcVar7 = *dst;
    *dst = pcVar7 + 1;
    *pcVar7 = cVar9;
    pcVar8 = *src;
  }
  pcVar5 = *dst;
  pcVar7 = pcVar8 + 1;
  *src = pcVar7;
LAB_001257b2:
  cVar9 = *pcVar7;
  goto LAB_001255f3;
}

Assistant:

int GetMacroArgumentValue(char* & src, char* & dst) {
	SkipBlanks(src);
	const char* const dstOrig = dst, * const srcOrig = src;
	const char* dstStopTrim = dst;
	while (*src && ',' != *src) {
		// check if there is some kind of delimiter next (string literal or angle brackets expression)
		// the angle-bracket can only be used around whole argument (i.e. '<' must be first char)
		EDelimiterType delI = DelimiterBegins(src, srcOrig==src ? delimiters_all : delimiters_noAngle, false);
		// CPP numeric literals heuristic (eating digit-group apostrophes as regular digit char)
		if (DT_APOSTROPHE == delI && srcOrig < src) {
			const char prevC = 0x20 | src[-1];	// also lowercase any ASCII letter
			if (('0' <= prevC && prevC <= '9') || ('a' <= prevC && prevC <= 'f')) {
				// ahead of apostrophe is character which can work as digit (up to hexa system)
				// this heuristic doesn't bother to be super precise, because string-apostrophe
				// should be on word boundary any way, not preceded by *any* digit of any base.
				const char nextC = 0x20 | src[1];
				if (('0' <= nextC && nextC <= '9') || ('a' <= nextC && nextC <= 'f')) {
					// by same logic, if also char after the apostrophe is any digit (up to base16)
					// turn the apostrophe from delimiter into digit-grouping char
					delI = DT_NONE;
				}
			}
		}
		if (DT_NONE == delI) {		// no delimiter found, ordinary expression, copy char by char
			*dst++ = *src++;
			continue;
		}
		// some delimiter found - parse those properly by their type
		if (DT_ANGLE != delI) *dst++ = *src;	// quotes are part of parsed value, angles are NOT
		++src;									// advance over delimiter
		const char endCh = delimiters_e[delI];	// set expected ending delimiter
		while (*src) {
			// handle escape sequences by the type of delimiter
			switch (delI) {
			case DT_ANGLE:
				if (('!' == *src && '!' == src[1]) || ('!' == *src && '>' == src[1])) {
					*dst++ = src[1]; src += 2;	// escape sequence is converted into final char
					continue;
				}
				break;
			case DT_QUOTES:
				if ('\\' == *src && src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy escape + escaped char (*any* non zero char)
				}
				break;
			case DT_APOSTROPHE:
				if ('\'' == *src && '\'' == src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy two apostrophes (escaped apostrophe)
				}
				break;
			default:	Error("Internal error. GetMacroArgumentValue()", NULL, FATAL);
			}
			if (endCh == *src) break;			// ending delimiter found
			*dst++ = *src++;					// just copy character
		}
		// ending delimiter must be identical to endCh
		if (endCh != *src) {
			*dst = 0;							// zero terminator of resulting string value
			return 0;
		}
		// set ending delimiter for quotes and apostrophe (angles are stripped from value)
		if (DT_QUOTES == delI || DT_APOSTROPHE == delI) *dst++ = endCh;
		dstStopTrim = dst;						// should not trim right spaces beyond this point
		++src;									// advance over delimiter
	}
	while (dstStopTrim < dst && White(dst[-1])) --dst;	// trim the right size space from value
	*dst = 0;									// zero terminator of resulting string value
	if (! *dstOrig) Warning("[Macro argument parser] empty value", srcOrig);
	return 1;
}